

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O0

BOOL temp_use_consistent(List *code,Token *one_use)

{
  BOOL BVar1;
  bool local_29;
  Token *t;
  Token *one_use_local;
  List *code_local;
  
  if (code == (List *)0x0) {
    code_local._4_4_ = TRUE;
  }
  else if ((((code->token).type == TOK_TEMP_REGISTER) &&
           ((code->token).u.reginfo.which == (one_use->u).reginfo.which)) &&
          (((code->token).u.reginfo.sgnd != (one_use->u).reginfo.sgnd ||
           ((code->token).u.reginfo.size != (one_use->u).reginfo.size)))) {
    code_local._4_4_ = FALSE;
  }
  else {
    BVar1 = temp_use_consistent(code->car,one_use);
    local_29 = false;
    if (BVar1 != FALSE) {
      BVar1 = temp_use_consistent(code->cdr,one_use);
      local_29 = BVar1 != FALSE;
    }
    code_local._4_4_ = (BOOL)local_29;
  }
  return code_local._4_4_;
}

Assistant:

static BOOL
temp_use_consistent (List *code, Token *one_use)
{
  Token *t;

  /* Recursion base case. */
  if (code == NULL)
    return TRUE;

  /* If this is a usage of the specified temp reg, see if it is used in
   * the same way as ONE_USE.
   */
  t = &code->token;
  if (t->type == TOK_TEMP_REGISTER
      && t->u.reginfo.which == one_use->u.reginfo.which)
    {
      if (t->u.reginfo.sgnd != one_use->u.reginfo.sgnd
	  || t->u.reginfo.size != one_use->u.reginfo.size)
	return FALSE;
    }

  /* Recurse. */
  return (temp_use_consistent (code->car, one_use)
	  && temp_use_consistent (code->cdr, one_use));
}